

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O2

bool imports_util::isNameValid(Executable *pe,char *myName)

{
  bool bVar1;
  bufsize_t maxInp;
  size_t sVar2;
  allocator<char> local_31;
  string local_30;
  
  if (((myName != (char *)0x0) &&
      (maxInp = AbstractByteBuffer::getMaxSizeFromPtr(&pe->super_AbstractByteBuffer,(BYTE *)myName),
      maxInp != 0)) && (bVar1 = pe_util::hasNonPrintable(myName,maxInp), !bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,myName,&local_31);
    sVar2 = pe_util::noWhiteCount(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return sVar2 != 0;
  }
  return false;
}

Assistant:

bool imports_util::isNameValid(Executable *pe, char* myName)
{
    if (!myName) return false; // do not parse, invalid entry
    bufsize_t upperLimit = pe->getMaxSizeFromPtr((BYTE*) myName);
    if (upperLimit == 0) return false;

    bool isInvalid = pe_util::hasNonPrintable(myName, upperLimit);
    if (isInvalid) return false;
    if (pe_util::noWhiteCount(myName) == 0) return false;

    return true;
}